

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitRefFunc(I64ToI32Lowering *this,RefFunc *curr)

{
  size_t *this_00;
  Type *pTVar1;
  Type *pTVar2;
  Type TVar3;
  Type TVar4;
  Type TVar5;
  bool bVar6;
  Signature sig_00;
  undefined1 local_88 [8];
  Signature sig;
  Type local_70;
  Type t;
  Type local_60;
  undefined1 local_58 [8];
  Iterator __begin3;
  Iterator __begin2;
  
  TVar5.id = (uintptr_t)
             &(curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)wasm::Type::getHeapType((Type *)TVar5.id);
  this_00 = &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  _local_88 = HeapType::getSignature((HeapType *)this_00);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)local_88;
  pTVar1 = (Type *)wasm::Type::size((Type *)local_88);
  if ((pTVar1 == (Type *)0x0) &&
     ((Type *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index ==
      (Type *)local_88)) {
    bVar6 = false;
  }
  else {
    bVar6 = false;
    t.id = TVar5.id;
    do {
      pTVar2 = wasm::Type::Iterator::operator*((Iterator *)this_00);
      TVar5 = t;
      if (pTVar2->id == 3) {
        bVar6 = true;
        break;
      }
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar1) ||
            ((Type *)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index != (Type *)local_88));
  }
  if (bVar6) {
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])local_88;
    pTVar1 = (Type *)wasm::Type::size((Type *)local_88);
    while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
            pTVar1 || (local_58 != (undefined1  [8])local_88))) {
      pTVar2 = wasm::Type::Iterator::operator*((Iterator *)local_58);
      local_70.id = pTVar2->id;
      if (local_70.id == 3) {
        local_60.id = 2;
        if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
            (Type *)0x0) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index,(iterator)0x0,&local_60);
        }
        else {
          (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)->id
               = 2;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent +
               1;
        }
        local_60.id = 2;
        if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
            (Type *)0x0) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index,(iterator)0x0,&local_60);
        }
        else {
          (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)->id
               = 2;
LAB_008ea6a4:
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent +
               1;
        }
      }
      else {
        if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
            (Type *)0x0) {
          (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent)->id
               = (uintptr_t)local_70;
          goto LAB_008ea6a4;
        }
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_70);
      }
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    }
    wasm::Type::Type((Type *)local_58,
                     (Tuple *)&__begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
    TVar3.id = (uintptr_t)local_58;
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      operator_delete((void *)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,
                      -__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index);
    }
  }
  else {
    TVar3.id = (uintptr_t)local_88;
  }
  if ((undefined1  [8])TVar3.id != local_88 || sig.params.id == 3) {
    TVar4.id = 2;
    if (sig.params.id != 3) {
      TVar4.id = sig.params.id;
    }
    sig_00.results.id = TVar4.id;
    sig_00.params.id = TVar3.id;
    HeapType::HeapType((HeapType *)&sig.results,sig_00);
    TVar3 = wasm::Type::with(TVar5.id,sig.results.id);
    ((Type *)TVar5.id)->id = TVar3.id;
  }
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    auto sig = curr->type.getHeapType().getSignature();

    bool hasI64Param = false;
    for (auto t : sig.params) {
      if (t == Type::i64) {
        hasI64Param = true;
        break;
      }
    }
    auto params = sig.params;
    if (hasI64Param) {
      std::vector<Type> newParams;
      for (auto t : sig.params) {
        if (t == Type::i64) {
          newParams.push_back(Type::i32);
          newParams.push_back(Type::i32);
        } else {
          newParams.push_back(t);
        }
      }
      params = Type(newParams);
    };
    auto results = sig.results;
    // Update the results the same way we do when visiting functions. We use a
    // global rather than multivalue to lower i64 results.
    if (results == Type::i64) {
      results = Type::i32;
    }

    if (params != sig.params || results != sig.results) {
      curr->type = curr->type.with(HeapType(Signature(params, results)));
    }
  }